

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O0

void gimage::gauss<float>
               (Image<float,_gimage::PixelTraits<float>_> *target,
               Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  int iVar1;
  GaussKernel *pGVar2;
  long w;
  Image<float,_gimage::PixelTraits<float>_> *this;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  float fVar4;
  long k_2;
  long k_1;
  long i_1;
  long i;
  long k;
  float *tp;
  int d;
  float *p;
  ImageFloat tmp;
  GaussKernel kernel;
  float in_stack_fffffffffffffedc;
  GaussKernel *in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int d_00;
  Image<float,_gimage::PixelTraits<float>_> *h;
  GaussKernel *this_00;
  GaussKernel *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  float *local_88;
  int local_7c;
  Image<float,_gimage::PixelTraits<float>_> local_60;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  GaussKernel::GaussKernel(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  Image<float,_gimage::PixelTraits<float>_>::Image
            ((Image<float,_gimage::PixelTraits<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,(long)in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffedc);
  pGVar2 = (GaussKernel *)Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_60,0,0,0);
  h = local_8;
  this_00 = pGVar2;
  w = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
  this = (Image<float,_gimage::PixelTraits<float>_> *)
         Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (this,w,(long)h,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_7c = 0;
  while( true ) {
    d_00 = local_7c;
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
    if (iVar1 <= d_00) break;
    local_88 = Image<float,_gimage::PixelTraits<float>_>::getPtr(local_8,0,0,local_7c);
    local_90 = 0;
    while( true ) {
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
      if (lVar3 <= local_90) break;
      local_98 = 0;
      while( true ) {
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
        if (lVar3 <= local_98) break;
        fVar4 = GaussKernel::convolveHorizontal<float>(this_00,this,w,(long)h,d_00);
        *local_88 = fVar4;
        local_98 = local_98 + 1;
        local_88 = local_88 + 1;
      }
      local_90 = local_90 + 1;
    }
    local_a0 = 0;
    while( true ) {
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
      if (lVar3 <= local_a0) break;
      local_a8 = 0;
      while( true ) {
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
        if (lVar3 <= local_a8) break;
        in_stack_fffffffffffffef4 =
             GaussKernel::convolveVertical<float>(this_00,this,w,(long)h,d_00);
        *(float *)((long)&pGVar2->kernel + local_a8 * 4) = in_stack_fffffffffffffef4;
        local_a8 = local_a8 + 1;
      }
      local_88 = Image<float,_gimage::PixelTraits<float>_>::getPtr(local_8,local_a0,0,local_7c);
      local_b0 = (GaussKernel *)0x0;
      while( true ) {
        in_stack_fffffffffffffee0 = local_b0;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
        if (lVar3 <= (long)in_stack_fffffffffffffee0) break;
        *local_88 = *(float *)((long)&pGVar2->kernel + (long)local_b0 * 4);
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        local_88 = local_88 + lVar3;
        local_b0 = (GaussKernel *)((long)&local_b0->kernel + 1);
      }
      local_a0 = local_a0 + 1;
    }
    local_7c = local_7c + 1;
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image
            ((Image<float,_gimage::PixelTraits<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  GaussKernel::~GaussKernel(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void gauss(Image<T> &target, const Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(image.getHeight(), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  target.setSize(image.getWidth(), image.getHeight(), image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into target image

    T *tp=target.getPtr(0, 0, d);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(kernel.convolveHorizontal(image, i, k, d));
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(target, i, k, d);
      }

      tp=target.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=target.getWidth();
      }
    }
  }
}